

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseFactor(Parser *this)

{
  function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *in_RSI;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x18);
  *(code **)local_40._M_unused._0_8_ = parseUnary;
  *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = 0;
  *(function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> **)
   ((long)local_40._M_unused._0_8_ + 0x10) = in_RSI;
  local_28 = std::
             _Function_handler<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(),_std::_Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>_>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(),_std::_Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>_>
             ::_M_manager;
  local_68 = 0;
  uStack_60 = 0;
  local_50 = std::
             _Function_handler<bool_(const_Token_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/src/Parser.cpp:164:26)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(const_Token_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/src/Parser.cpp:164:26)>
             ::_M_manager;
  parseExpression(this,in_RSI,(function<bool_(const_Token_&)> *)&local_40);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseFactor()
{
  const auto predicate = [](const Token& token) 
  { 
    return token.type == TokenType::Mul ||
      token.type == TokenType::Div; 
  };
  return parseExpression(std::bind(&Parser::parseUnary, this), predicate);
}